

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

either * toml::detail::syntax::quoted_key(either *__return_storage_ptr__,spec *s)

{
  sequence local_50;
  sequence local_30;
  
  basic_string(&local_30,s);
  literal_string(&local_50,s);
  either::either<toml::detail::sequence,toml::detail::sequence>
            (__return_storage_ptr__,&local_30,&local_50);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_30.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE either quoted_key(const spec& s)
{
    return either(basic_string(s), literal_string(s));
}